

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadType(BinaryReader *this,Type *out_value,char *desc)

{
  bool bVar1;
  Type local_48;
  Type local_40;
  Enum local_38;
  uint32_t local_34;
  Enum local_30;
  uint32_t heap_type;
  char *pcStack_28;
  uint32_t type;
  char *desc_local;
  Type *out_value_local;
  BinaryReader *this_local;
  
  heap_type = 0;
  pcStack_28 = desc;
  desc_local = (char *)out_value;
  out_value_local = (Type *)this;
  local_30 = (Enum)ReadS32Leb128(this,&heap_type,desc);
  bVar1 = Failed((Result)local_30);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (heap_type == 0xffffffeb) {
      local_34 = 0;
      local_38 = (Enum)ReadS32Leb128(this,&local_34,pcStack_28);
      bVar1 = Failed((Result)local_38);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      Type::Type(&local_40,Reference,local_34);
      *(Type *)desc_local = local_40;
    }
    else {
      Type::Type(&local_48,heap_type);
      *(Type *)desc_local = local_48;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  if (static_cast<Type::Enum>(type) == Type::Reference) {
    uint32_t heap_type = 0;
    CHECK_RESULT(ReadS32Leb128(&heap_type, desc));
    *out_value = Type(Type::Reference, heap_type);
  } else {
    *out_value = static_cast<Type>(type);
  }
  return Result::Ok;
}